

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O0

bool __thiscall ChainstateManager::BackgroundSyncInProgress(ChainstateManager *this)

{
  long lVar1;
  bool bVar2;
  Chainstate *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  undefined1 uVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::get
            ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
             CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  bVar2 = IsUsable((ChainstateManager *)
                   CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8),in_RDI);
  uVar3 = false;
  if (bVar2) {
    std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::get
              ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
               CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
    uVar3 = IsUsable((ChainstateManager *)CONCAT17(uVar3,in_stack_ffffffffffffffe8),in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)uVar3;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(GetMutex()) {
        return IsUsable(m_snapshot_chainstate.get()) && IsUsable(m_ibd_chainstate.get());
    }